

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.h
# Opt level: O3

bool __thiscall
absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<float>
          (FormatArgImpl *this,Data arg,FormatConversionSpecImpl spec,void *out)

{
  bool bVar1;
  byte bVar2;
  Data local_10;
  ulong local_8;
  
  bVar2 = arg.buf[0];
  if ((((ulong)arg.ptr & 0xff) != 0x13) && ((2L << (bVar2 & 0x3f) & 0x9fe00U) != 0)) {
    local_8 = (ulong)spec._0_4_;
    if (bVar2 == 0x12) {
      local_10._1_7_ = arg._1_7_;
      local_10.buf[0] = 0xc;
    }
    else {
      local_10 = arg;
      if ((bVar2 & 0xf8) != 8) {
        return false;
      }
    }
    bVar1 = ConvertFloatImpl(SUB84(this,0),(FormatConversionSpecImpl *)&local_10,
                             (FormatSinkImpl *)
                             CONCAT44((int)((ulong)register0x00000008 >> 0x20),spec.precision_));
    return bVar1;
  }
  return false;
}

Assistant:

static bool Dispatch(Data arg, FormatConversionSpecImpl spec, void* out) {
    // A `none` conv indicates that we want the `int` conversion.
    if (ABSL_PREDICT_FALSE(spec.conversion_char() ==
                           FormatConversionCharInternal::kNone)) {
      return ToInt<T>(arg, static_cast<int*>(out), std::is_integral<T>(),
                      std::is_enum<T>());
    }
    if (ABSL_PREDICT_FALSE(!Contains(ArgumentToConv<T>(),
                                     spec.conversion_char()))) {
      return false;
    }
    return str_format_internal::FormatConvertImpl(
               Manager<T>::Value(arg), spec,
               static_cast<FormatSinkImpl*>(out))
        .value;
  }